

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O0

size_type __thiscall
google::protobuf::stringpiece_internal::StringPiece::rfind
          (StringPiece *this,StringPiece s,size_type pos)

{
  unsigned_long *puVar1;
  char *pcVar2;
  size_type local_68;
  char *result;
  char *local_40;
  char *last;
  size_t ulen;
  size_type pos_local;
  StringPiece *this_local;
  StringPiece s_local;
  
  s_local.ptr_ = (char *)s.length_;
  this_local = (StringPiece *)s.ptr_;
  if ((char *)this->length_ < s_local.ptr_) {
    s_local.length_ = 0xffffffffffffffff;
  }
  else {
    last = (char *)this->length_;
    ulen = pos;
    pos_local = (size_type)this;
    if (s_local.ptr_ == (char *)0x0) {
      puVar1 = std::min<unsigned_long>((unsigned_long *)&last,&ulen);
      s_local.length_ = *puVar1;
    }
    else {
      pcVar2 = this->ptr_;
      result = last + -(long)s_local.ptr_;
      puVar1 = std::min<unsigned_long>((unsigned_long *)&result,&ulen);
      local_40 = s_local.ptr_ + (long)(pcVar2 + *puVar1);
      pcVar2 = std::find_end<char_const*,char_const*>
                         (this->ptr_,local_40,(char *)this_local,
                          s_local.ptr_ + (long)&this_local->ptr_);
      if (pcVar2 == local_40) {
        local_68 = 0xffffffffffffffff;
      }
      else {
        local_68 = (long)pcVar2 - (long)this->ptr_;
      }
      s_local.length_ = local_68;
    }
  }
  return s_local.length_;
}

Assistant:

StringPiece::size_type StringPiece::rfind(StringPiece s, size_type pos) const {
  if (length_ < s.length_) return npos;
  const size_t ulen = length_;
  if (s.length_ == 0) return std::min(ulen, pos);

  const char* last = ptr_ + std::min(ulen - s.length_, pos) + s.length_;
  const char* result = std::find_end(ptr_, last, s.ptr_, s.ptr_ + s.length_);
  return result != last ? result - ptr_ : npos;
}